

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O0

void dg::dda::reportIncompatibleCalls
               (set<const_llvm::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<const_llvm::Function_*>_>
                *incompatibleCalls,CallInst *CInst,size_t tried_num)

{
  bool bVar1;
  char *pcVar2;
  char *in_RDX;
  raw_ostream *in_RSI;
  ValInfo *in_stack_00000048;
  raw_ostream *in_stack_00000050;
  ValInfo local_20;
  
  bVar1 = std::
          set<const_llvm::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<const_llvm::Function_*>_>
          ::empty((set<const_llvm::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<const_llvm::Function_*>_>
                   *)0x19f55d);
  if ((!bVar1) &&
     (pcVar2 = (char *)std::
                       set<const_llvm::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<const_llvm::Function_*>_>
                       ::size((set<const_llvm::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<const_llvm::Function_*>_>
                               *)0x19f56f), pcVar2 == in_RDX)) {
    llvm::errs();
    llvm::raw_ostream::operator<<(in_RSI,in_RDX);
    ValInfo::ValInfo(&local_20,(Value *)in_RSI);
    operator<<(in_stack_00000050,in_stack_00000048);
    llvm::raw_ostream::operator<<(in_RSI,in_RDX);
  }
  return;
}

Assistant:

static void reportIncompatibleCalls(
        const std::set<const llvm::Function *> &incompatibleCalls,
        const llvm::CallInst *CInst, size_t tried_num) {
    if (incompatibleCalls.empty()) {
        return;
    }

#ifndef NDEBUG
    llvm::errs() << "[RWG] warning: incompatible function pointers for "
                 << ValInfo(CInst) << "\n";

    for (auto *F : incompatibleCalls) {
        llvm::errs() << "   Tried: " << F->getName() << " of type "
                     << *F->getType() << "\n";
    }
#endif
    if (incompatibleCalls.size() == tried_num) {
        llvm::errs() << "[RWG] error: did not find any compatible function "
                        "pointer for "
                     << ValInfo(CInst) << "\n";
    }
}